

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoInline.cpp
# Opt level: O0

Pass * wasm::createNoFullInlinePass(void)

{
  NoInline *this;
  
  this = (NoInline *)operator_new(0x60);
  anon_unknown_0::NoInline::NoInline(this,Full);
  return &this->super_Pass;
}

Assistant:

Pass* createNoFullInlinePass() { return new NoInline(NoInlineMode::Full); }